

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O3

void __thiscall
cfd::core::TaprootScriptTree::TaprootScriptTree(TaprootScriptTree *this,TaprootScriptTree *tap_tree)

{
  byte bVar1;
  CfdException *this_00;
  long lVar2;
  undefined1 local_50 [32];
  
  TapBranch::TapBranch(&this->super_TapBranch,&tap_tree->super_TapBranch);
  (this->super_TapBranch)._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_008795a8;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = (tap_tree->super_TapBranch).leaf_version_;
  lVar2 = 0;
  do {
    if (*(uint *)((long)TaprootUtil::IsValidLeafVersion::kValidLeafVersions + lVar2) == (uint)bVar1)
    goto LAB_00385156;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x24);
  if (((bVar1 & 1) != 0) || (0x3e < (byte)(bVar1 + 0x40))) {
    local_50._0_8_ = "cfdcore_taproot.cpp";
    local_50._8_4_ = 0x23b;
    local_50._16_8_ = "TaprootScriptTree";
    logger::log<unsigned_char_const&>
              ((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"Unsupported leaf version. [{}]",
               &(tap_tree->super_TapBranch).leaf_version_);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    local_50._0_8_ = local_50 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Unsupported leaf version.","");
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_50);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
LAB_00385156:
  (this->super_TapBranch).has_leaf_ = (tap_tree->super_TapBranch).has_leaf_;
  (this->super_TapBranch).leaf_version_ = bVar1;
  Script::operator=(&(this->super_TapBranch).script_,&(tap_tree->super_TapBranch).script_);
  ByteData256::operator=
            (&(this->super_TapBranch).root_commitment_,&(tap_tree->super_TapBranch).root_commitment_
            );
  ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::operator=
            (&(this->super_TapBranch).branch_list_,&(tap_tree->super_TapBranch).branch_list_);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::operator=
            (&this->nodes_,&tap_tree->nodes_);
  (this->super_TapBranch).is_elements_ = (tap_tree->super_TapBranch).is_elements_;
  return;
}

Assistant:

TaprootScriptTree::TaprootScriptTree(const TaprootScriptTree& tap_tree)
    : TapBranch(tap_tree) {
  if (!TaprootUtil::IsValidLeafVersion(tap_tree.leaf_version_)) {
    warn(
        CFD_LOG_SOURCE, "Unsupported leaf version. [{}]",
        tap_tree.leaf_version_);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unsupported leaf version.");
  }
  has_leaf_ = tap_tree.has_leaf_;
  leaf_version_ = tap_tree.leaf_version_;
  script_ = tap_tree.script_;
  root_commitment_ = tap_tree.root_commitment_;
  branch_list_ = tap_tree.branch_list_;
  nodes_ = tap_tree.nodes_;
  is_elements_ = tap_tree.is_elements_;
}